

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metal.h
# Opt level: O0

void __thiscall
phyr::MetalMaterial::MetalMaterial
          (MetalMaterial *this,shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *eta,
          shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *k,
          shared_ptr<phyr::Texture<double>_> *rough,shared_ptr<phyr::Texture<double>_> *urough,
          shared_ptr<phyr::Texture<double>_> *vrough,bool remapRoughness)

{
  shared_ptr<phyr::Texture<double>_> *in_RDI;
  byte in_stack_00000008;
  shared_ptr<phyr::Texture<double>_> *in_stack_ffffffffffffffb8;
  
  Material::Material((Material *)in_RDI);
  ((__shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2> *)
  &in_RDI->super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>)->_M_ptr =
       (element_type *)&PTR_computeScatteringFunctions_0028af08;
  std::shared_ptr<phyr::Texture<phyr::SampledSpectrum>_>::shared_ptr
            ((shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *)in_RDI,
             (shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *)in_stack_ffffffffffffffb8);
  std::shared_ptr<phyr::Texture<phyr::SampledSpectrum>_>::shared_ptr
            ((shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *)in_RDI,
             (shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *)in_stack_ffffffffffffffb8);
  std::shared_ptr<phyr::Texture<double>_>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  std::shared_ptr<phyr::Texture<double>_>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  std::shared_ptr<phyr::Texture<double>_>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  *(byte *)&in_RDI[5].super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = in_stack_00000008 & 1;
  return;
}

Assistant:

MetalMaterial(const std::shared_ptr<Texture<Spectrum>>& eta,
                  const std::shared_ptr<Texture<Spectrum>>& k,
                  const std::shared_ptr<Texture<Real>>& rough,
                  const std::shared_ptr<Texture<Real>>& urough,
                  const std::shared_ptr<Texture<Real>>& vrough,
                  bool remapRoughness) :
        eta(eta), k(k), roughness(rough), uRoughness(urough),
        vRoughness(vrough), remapRoughness(remapRoughness) {}